

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::integrate
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,size_t Nintegral)

{
  double dVar1;
  double dVar2;
  int iVar3;
  invalid_argument *this_00;
  Index IVar4;
  long lVar5;
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  double local_60;
  int local_54;
  double dStack_50;
  int i;
  double width;
  undefined1 local_40 [8];
  vectype c;
  size_t Nintegral_local;
  ChebyshevExpansion *this_local;
  
  if (Nintegral == 1) {
    IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
    width = (double)(IVar4 + 1);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_40,(long *)&width);
    dStack_50 = this->m_xmax - this->m_xmin;
    for (local_54 = 1; lVar5 = (long)local_54,
        IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this),
        lVar5 < IVar4 + 1; local_54 = local_54 + 1) {
      if (local_54 == 1) {
        pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this,0);
        dVar1 = *pdVar6;
        pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this,
                            (long)(local_54 + 1));
        dVar2 = *pdVar6;
        iVar3 = local_54 * 2;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                            (long)local_54);
        *pSVar7 = ((dVar1 + dVar1) - dVar2) / (double)iVar3;
      }
      else {
        iVar3 = local_54 + 1;
        IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
        if (IVar4 + -1 < (long)iVar3) {
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this,
                              (long)(local_54 + -1));
          dVar1 = *pdVar6;
          iVar3 = local_54 * 2;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40
                              ,(long)local_54);
          *pSVar7 = dVar1 / (double)iVar3;
        }
        else {
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this,
                              (long)(local_54 + -1));
          dVar1 = *pdVar6;
          pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)this,
                              (long)(local_54 + 1));
          dVar2 = *pdVar6;
          iVar3 = local_54 * 2;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40
                              ,(long)local_54);
          *pSVar7 = (dVar1 - dVar2) / (double)iVar3;
        }
      }
    }
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0);
    *pSVar7 = 0.0;
    local_60 = dStack_50 * 0.5;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40,&local_60);
    ChebyshevExpansion(__return_storage_ptr__,(vectype *)local_40,this->m_xmin,this->m_xmax);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Only support one integral for now");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::integrate(std::size_t Nintegral) const {
        // See Mason and Handscomb, p. 33, Eq. 2.44 & 2.45
        // and example in https ://github.com/numpy/numpy/blob/master/numpy/polynomial/chebyshev.py#L868-L964
        if (Nintegral != 1) { throw std::invalid_argument("Only support one integral for now"); }
        vectype c(m_c.size() + 1);
        double width = m_xmax - m_xmin;
        for (auto i = 1; i < m_c.size()+1; ++i) {
            if (i == 1) {
                // This special case is needed because the prime on the summation in Mason indicates the first coefficient 
                // is to be divided by two
                c[i] = (2*m_c[i - 1] - m_c[i + 1]) / (2 * i);
            }
            else if (i + 1 > m_c.size()-1) {
                c[i] = (m_c[i - 1]) / (2 * i);
            }
            else {
                c[i] = (m_c[i - 1] - m_c[i + 1]) / (2 * i);
            }
        }
        c(0) = 0; // This is the arbitrary constant;
        c *= width / 2;
        return ChebyshevExpansion(std::move(c), m_xmin, m_xmax);
    }